

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_layer2.c
# Opt level: O0

_Bool oonf_layer2_neigh_commit(oonf_layer2_neigh *l2neigh)

{
  bool bVar1;
  ulong local_28;
  size_t i;
  oonf_layer2_neigh *l2neigh_local;
  
  if (((l2neigh->destinations).count == 0) && ((l2neigh->remote_neighbor_ips).count == 0)) {
    for (local_28 = 0; local_28 < 0x1a; local_28 = local_28 + 1) {
      bVar1 = false;
      if (l2neigh->data[local_28]._origin != (oonf_layer2_origin *)0x0) {
        bVar1 = l2neigh->data[local_28]._meta != (oonf_layer2_metadata *)0x0;
      }
      if (bVar1) {
        oonf_class_event(&_l2neighbor_class,l2neigh,OONF_OBJECT_CHANGED);
        l2neigh->modified = OONF_LAYER2_NEIGH_MODIFY_NONE;
        return false;
      }
    }
    _neigh_remove(l2neigh);
    l2neigh_local._7_1_ = true;
  }
  else {
    oonf_class_event(&_l2neighbor_class,l2neigh,OONF_OBJECT_CHANGED);
    l2neigh->modified = OONF_LAYER2_NEIGH_MODIFY_NONE;
    l2neigh_local._7_1_ = false;
  }
  return l2neigh_local._7_1_;
}

Assistant:

bool
oonf_layer2_neigh_commit(struct oonf_layer2_neigh *l2neigh) {
  size_t i;

  if (l2neigh->destinations.count > 0 || l2neigh->remote_neighbor_ips.count > 0) {
    oonf_class_event(&_l2neighbor_class, l2neigh, OONF_OBJECT_CHANGED);
    l2neigh->modified = OONF_LAYER2_NEIGH_MODIFY_NONE;
    return false;
  }

  for (i = 0; i < OONF_LAYER2_NEIGH_COUNT; i++) {
    if (oonf_layer2_data_has_value(&l2neigh->data[i])) {
      oonf_class_event(&_l2neighbor_class, l2neigh, OONF_OBJECT_CHANGED);
      l2neigh->modified = OONF_LAYER2_NEIGH_MODIFY_NONE;
      return false;
    }
  }

  _neigh_remove(l2neigh);
  return true;
}